

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall YAML::Emitter::PrepareTopNode(Emitter *this,value child)

{
  bool bVar1;
  size_t sVar2;
  pointer pEVar3;
  int in_ESI;
  long in_RDI;
  Emitter *unaff_retaddr;
  Emitter *in_stack_00000060;
  char (*in_stack_ffffffffffffffd8) [2];
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  long lVar4;
  undefined1 requireSpace;
  
  if (in_ESI == 0) {
    return;
  }
  lVar4 = in_RDI;
  std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::operator->
            ((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)0xef7e4d);
  requireSpace = (undefined1)((ulong)lVar4 >> 0x38);
  sVar2 = EmitterState::CurGroupChildCount
                    ((EmitterState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if ((sVar2 != 0) && (sVar2 = ostream_wrapper::col((ostream_wrapper *)(in_RDI + 8)), sVar2 != 0)) {
    EmitBeginDoc(in_stack_00000060);
  }
  if (in_ESI == 0) {
    return;
  }
  if (in_ESI - 1U < 3) {
LAB_00ef7eb7:
    pEVar3 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
             operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                        0xef7ec1);
    EmitterState::HasBegunContent(pEVar3);
    SpaceOrIndentTo(unaff_retaddr,(bool)requireSpace,CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  else {
    if (in_ESI != 4) {
      if (in_ESI == 5) goto LAB_00ef7eb7;
      if (in_ESI != 6) {
        return;
      }
    }
    pEVar3 = std::unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>::
             operator->((unique_ptr<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_> *)
                        0xef7ee9);
    bVar1 = EmitterState::HasBegunNode(pEVar3);
    if (bVar1) {
      YAML::operator<<((ostream_wrapper *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void Emitter::PrepareTopNode(EmitterNodeType::value child) {
  if (child == EmitterNodeType::NoType)
    return;

  if (m_pState->CurGroupChildCount() > 0 && m_stream.col() > 0)
    EmitBeginDoc();

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      // TODO: if we were writing null, and
      // we wanted it blank, we wouldn't want a space
      SpaceOrIndentTo(m_pState->HasBegunContent(), 0);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      if (m_pState->HasBegunNode())
        m_stream << "\n";
      break;
  }
}